

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

int __thiscall QHeaderView::logicalIndex(QHeaderView *this,int visualIndex)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  if (visualIndex < 0) {
    return -1;
  }
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(int *)(lVar1 + 0x650) == 0) {
    iVar3 = (int)*(undefined8 *)(lVar1 + 0x658);
  }
  else {
    iVar3 = (int)*(undefined8 *)(lVar1 + 0x648);
  }
  iVar2 = -1;
  if (visualIndex < iVar3) {
    iVar2 = visualIndex;
  }
  if (iVar3 <= visualIndex || *(int *)(lVar1 + 0x650) == 0) {
    return iVar2;
  }
  if (*(long *)(lVar1 + 0x580) != 0) {
    return *(int *)(*(long *)(lVar1 + 0x578) + (ulong)(uint)visualIndex * 4);
  }
  return visualIndex;
}

Assistant:

int QHeaderView::logicalIndex(int visualIndex) const
{
    Q_D(const QHeaderView);
    if (visualIndex < 0 || visualIndex >= d->sectionCount())
        return -1;

    if (d->noSectionMemoryUsage())
        return visualIndex;

    return d->logicalIndex(visualIndex);
}